

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void get_tile_stats(AV1_COMMON *cm,TileDataEnc *tile_data,int *max_tile_size,
                   int *max_superres_tile_width,int *min_cropped_tile_width,
                   int *min_cropped_tile_height,int *tile_width_valid)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int *in_R8;
  int *in_R9;
  uint *in_stack_00000008;
  int is_right_most_tile;
  int cropped_tile_height;
  int cropped_tile_width;
  int supperres_tile_width;
  int tile_size;
  int tile_height;
  int tile_width;
  TileInfo *tile_info;
  int tile_col;
  int tile_row;
  int superres_scale_denominator;
  int tile_rows;
  int tile_cols;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_44;
  int local_40;
  
  iVar2 = (in_RDI->tiles).cols;
  iVar3 = (in_RDI->tiles).rows;
  bVar1 = in_RDI->superres_scale_denominator;
  *in_RDX = 0;
  *in_RCX = 0;
  *in_R8 = 0x7fffffff;
  *in_R9 = 0x7fffffff;
  *in_stack_00000008 = 1;
  for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
      piVar6 = (int *)(in_RSI + (long)(local_40 * (in_RDI->tiles).cols + local_44) * 0x5d10);
      iVar4 = (piVar6[3] - piVar6[2]) * 4;
      local_70 = iVar4 * (piVar6[1] - *piVar6) * 4;
      if (local_70 < *in_RDX) {
        local_70 = *in_RDX;
      }
      *in_RDX = local_70;
      local_74 = (int)(iVar4 * (uint)bVar1) / 8;
      if (local_74 < *in_RCX) {
        local_74 = *in_RCX;
      }
      *in_RCX = local_74;
      local_78 = in_RDI->width + piVar6[2] * -4;
      local_7c = in_RDI->height + *piVar6 * -4;
      if (*in_R8 < local_78) {
        local_78 = *in_R8;
      }
      *in_R8 = local_78;
      if (*in_R9 < local_7c) {
        local_7c = *in_R9;
      }
      *in_R9 = local_7c;
      if (piVar6[3] != (in_RDI->mi_params).mi_cols) {
        iVar5 = av1_superres_scaled(in_RDI);
        if (iVar5 == 0) {
          *in_stack_00000008 = (uint)(0x3f < iVar4) & *in_stack_00000008;
        }
        else {
          *in_stack_00000008 = (uint)(0x7f < iVar4) & *in_stack_00000008;
        }
      }
    }
  }
  return;
}

Assistant:

static void get_tile_stats(const AV1_COMMON *const cm,
                           const TileDataEnc *const tile_data,
                           int *max_tile_size, int *max_superres_tile_width,
                           int *min_cropped_tile_width,
                           int *min_cropped_tile_height,
                           int *tile_width_valid) {
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int superres_scale_denominator = cm->superres_scale_denominator;

  *max_tile_size = 0;
  *max_superres_tile_width = 0;
  *min_cropped_tile_width = INT_MAX;
  *min_cropped_tile_height = INT_MAX;
  *tile_width_valid = 1;

  for (int tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (int tile_col = 0; tile_col < tile_cols; ++tile_col) {
      const TileInfo *const tile_info =
          &tile_data[tile_row * cm->tiles.cols + tile_col].tile_info;
      const int tile_width =
          (tile_info->mi_col_end - tile_info->mi_col_start) * MI_SIZE;
      const int tile_height =
          (tile_info->mi_row_end - tile_info->mi_row_start) * MI_SIZE;
      const int tile_size = tile_width * tile_height;
      *max_tile_size = AOMMAX(*max_tile_size, tile_size);

      const int supperres_tile_width =
          tile_width * superres_scale_denominator / SCALE_NUMERATOR;
      *max_superres_tile_width =
          AOMMAX(*max_superres_tile_width, supperres_tile_width);

      const int cropped_tile_width =
          cm->width - tile_info->mi_col_start * MI_SIZE;
      const int cropped_tile_height =
          cm->height - tile_info->mi_row_start * MI_SIZE;
      *min_cropped_tile_width =
          AOMMIN(*min_cropped_tile_width, cropped_tile_width);
      *min_cropped_tile_height =
          AOMMIN(*min_cropped_tile_height, cropped_tile_height);

      const int is_right_most_tile =
          tile_info->mi_col_end == cm->mi_params.mi_cols;
      if (!is_right_most_tile) {
        if (av1_superres_scaled(cm))
          *tile_width_valid &= tile_width >= 128;
        else
          *tile_width_valid &= tile_width >= 64;
      }
    }
  }
}